

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O1

void __thiscall CVmFormatter::buffer_rendered(CVmFormatter *this,wchar_t c,uchar flags,int wid)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  os_color_t oVar4;
  undefined4 uVar5;
  byte bVar6;
  
  if (this->linepos_ < 1) {
    bVar6 = 0;
  }
  else {
    bVar6 = this->flagbuf_[this->linepos_ - 1] & 1;
  }
  if (wid != 0) {
    do {
      this->linebuf_[this->linepos_] = c;
      this->flagbuf_[this->linepos_] = flags;
      iVar3 = this->linepos_;
      uVar5 = *(undefined4 *)&(this->cur_color_).field_0x14;
      this->colorbuf_[iVar3].attr = (this->cur_color_).attr;
      *(undefined4 *)&this->colorbuf_[iVar3].field_0x14 = uVar5;
      oVar4 = (this->cur_color_).bg;
      this->colorbuf_[iVar3].fg = (this->cur_color_).fg;
      this->colorbuf_[iVar3].bg = oVar4;
      if (1 < wid) {
        this->flagbuf_[this->linepos_] = this->flagbuf_[this->linepos_] | bVar6;
      }
      uVar1 = this->linepos_;
      uVar2 = this->linecol_;
      this->linepos_ = uVar1 + 1;
      this->linecol_ = uVar2 + 1;
      wid = wid + -1;
    } while (wid != 0);
  }
  return;
}

Assistant:

void CVmFormatter::buffer_rendered(wchar_t c, unsigned char flags, int wid)
{
    unsigned char flags_before;

    /* note whether or not we have a break before us */
    flags_before = (linepos_ > 0
                    ? flagbuf_[linepos_-1] & VMCON_OBF_NOBREAK
                    : 0);

    /* add the character the given number of times */
    for ( ; wid != 0 ; --wid)
    {
        /* buffer the character */
        linebuf_[linepos_] = c;
        flagbuf_[linepos_] = flags;
        colorbuf_[linepos_] = cur_color_;

        /* 
         *   if this isn't the last part of the character, carry forward any
         *   no-break flag from the previous part of the character; this will
         *   ensure that a no-break to the left of the sequence applies to
         *   the entire sequence 
         */
        if (wid > 1)
            flagbuf_[linepos_] |= flags_before;

        /* advance one character in the buffer */
        ++linepos_;

        /* adjust our column counter */
        ++linecol_;
    }
}